

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O0

void __thiscall
so_5::disp::one_thread::impl::
actual_dispatcher_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
::actual_dispatcher_t
          (actual_dispatcher_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
           *this,disp_params_t *params)

{
  queue_params_t *this_00;
  lock_factory_t *__x;
  function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>_()>
  local_38;
  disp_params_t *local_18;
  disp_params_t *params_local;
  actual_dispatcher_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
  *this_local;
  
  local_18 = params;
  params_local = (disp_params_t *)this;
  actual_disp_iface_t::actual_disp_iface_t(&this->super_actual_disp_iface_t);
  (this->super_actual_disp_iface_t).super_dispatcher_t._vptr_dispatcher_t =
       (_func_int **)&PTR__actual_dispatcher_t_005c3b88;
  this_00 = one_thread::disp_params_t::queue_params(params);
  __x = mpsc_queue_traits::queue_params_t::lock_factory(this_00);
  std::
  function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>_()>
  ::function(&local_38,__x);
  reuse::work_thread::details::
  work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>::
  work_thread_template_t(&this->m_work_thread,&local_38);
  std::
  function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>_()>
  ::~function(&local_38);
  std::atomic<unsigned_long>::atomic(&this->m_agents_bound,0);
  data_source_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
  ::data_source_t(&this->m_data_source,&this->m_work_thread,&this->m_agents_bound);
  return;
}

Assistant:

actual_dispatcher_t( disp_params_t params )
			:	m_work_thread{ params.queue_params().lock_factory() }
			,	m_data_source( m_work_thread, m_agents_bound )
			{}